

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

void kj::anon_unknown_9::rmrfChildrenAndClose(int fd)

{
  byte bVar1;
  int iVar2;
  int osErrorNumber;
  DIR *__dirp;
  int *piVar3;
  dirent64 *pdVar4;
  size_t sVar5;
  ulong in_RCX;
  char *__s;
  StringPtr path;
  DebugExpression<bool> _kjCondition;
  Fault f_1;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_disk_unix_c__:167:3)>
  _kjDefer167;
  DIR *dir;
  DebugExpression<bool> local_41;
  Fault local_40;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_disk_unix_c__:167:3)>
  local_38;
  DIR *local_28;
  
  __dirp = fdopendir(fd);
  local_28 = __dirp;
  if (__dirp == (DIR *)0x0) {
    close(fd);
    piVar3 = __errno_location();
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0xa5,*piVar3,"fdopendir","");
    kj::_::Debug::Fault::fatal((Fault *)&local_38);
  }
  local_38.maybeFunc.ptr.isSet = true;
  local_38.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_disk_unix_c__:167:3)>_2
        )&local_28;
  piVar3 = __errno_location();
LAB_003c0b9b:
  *piVar3 = 0;
  pdVar4 = readdir64(__dirp);
  if (pdVar4 == (dirent64 *)0x0) {
    if (*piVar3 != 0) {
      kj::_::Debug::Fault::Fault
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0xb1,*piVar3,"readdir","");
      kj::_::Debug::Fault::fatal(&local_40);
    }
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++:167:3)>
    ::~Deferred(&local_38);
    return;
  }
  if (pdVar4->d_name[0] == '.') {
    bVar1 = pdVar4->d_name[1];
    in_RCX = (ulong)bVar1;
    __dirp = local_28;
    if ((bVar1 == 0) || ((bVar1 == 0x2e && (pdVar4->d_name[2] == '\0')))) goto LAB_003c0b9b;
  }
  __s = pdVar4->d_name;
  if (pdVar4->d_type == '\0') {
    sVar5 = strlen(__s);
    path.content.size_ = in_RCX;
    path.content.ptr = (char *)(sVar5 + 1);
    local_41.value = rmrf((anon_unknown_9 *)(ulong)(uint)fd,(int)__s,path);
    __dirp = local_28;
    if (!local_41.value) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0xc6,FAILED,"rmrf(fd, entry->d_name)","_kjCondition,",&local_41);
      kj::_::Debug::Fault::fatal(&local_40);
    }
  }
  else if (pdVar4->d_type == '\x04') {
    do {
      iVar2 = openat64(fd,__s,0xb0000);
      if (-1 < iVar2) goto LAB_003c0c18;
      osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
    } while (osErrorNumber == -1);
    if (osErrorNumber != 0) {
      kj::_::Debug::Fault::Fault
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0xbf,osErrorNumber,
                 "subdirFd = openat( fd, entry->d_name, O_RDONLY | MAYBE_O_DIRECTORY | MAYBE_O_CLOEXEC | O_NOFOLLOW)"
                 ,"");
      kj::_::Debug::Fault::fatal(&local_40);
    }
LAB_003c0c18:
    rmrfChildrenAndClose(iVar2);
    do {
      iVar2 = unlinkat(fd,__s,0x200);
      __dirp = local_28;
      if (-1 < iVar2) goto LAB_003c0b9b;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    __dirp = local_28;
    if (iVar2 != 0) {
      kj::_::Debug::Fault::Fault
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0xc1,iVar2,"unlinkat(fd, entry->d_name, AT_REMOVEDIR)","");
      kj::_::Debug::Fault::fatal(&local_40);
    }
  }
  else {
    do {
      iVar2 = unlinkat(fd,__s,0);
      __dirp = local_28;
      if (-1 < iVar2) goto LAB_003c0b9b;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    __dirp = local_28;
    if (iVar2 != 0) {
      kj::_::Debug::Fault::Fault
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0xc3,iVar2,"unlinkat(fd, entry->d_name, 0)","");
      kj::_::Debug::Fault::fatal(&local_40);
    }
  }
  goto LAB_003c0b9b;
}

Assistant:

static void rmrfChildrenAndClose(int fd) {
  // Assumes fd is seeked to beginning.

  DIR* dir = fdopendir(fd);
  if (dir == nullptr) {
    close(fd);
    KJ_FAIL_SYSCALL("fdopendir", errno);
  };
  KJ_DEFER(closedir(dir));

  for (;;) {
    errno = 0;
    struct dirent* entry = readdir(dir);
    if (entry == nullptr) {
      int error = errno;
      if (error == 0) {
        break;
      } else {
        KJ_FAIL_SYSCALL("readdir", error);
      }
    }

    if (entry->d_name[0] == '.' &&
        (entry->d_name[1] == '\0' ||
         (entry->d_name[1] == '.' &&
          entry->d_name[2] == '\0'))) {
      // ignore . and ..
    } else {
#ifdef DT_UNKNOWN    // d_type is not available on all platforms.
      if (entry->d_type == DT_DIR) {
        int subdirFd;
        KJ_SYSCALL(subdirFd = openat(
            fd, entry->d_name, O_RDONLY | MAYBE_O_DIRECTORY | MAYBE_O_CLOEXEC | O_NOFOLLOW));
        rmrfChildrenAndClose(subdirFd);
        KJ_SYSCALL(unlinkat(fd, entry->d_name, AT_REMOVEDIR));
      } else if (entry->d_type != DT_UNKNOWN) {
        KJ_SYSCALL(unlinkat(fd, entry->d_name, 0));
      } else {
#endif
        KJ_ASSERT(rmrf(fd, entry->d_name));
#ifdef DT_UNKNOWN
      }
#endif
    }
  }
}